

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenExpressionRef BinaryenDrop(BinaryenModuleRef module,BinaryenExpressionRef value)

{
  Drop *this;
  
  this = (Drop *)MixedArena::allocSpace(&module->allocator,0x18,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
  (this->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
  this->value = value;
  wasm::Drop::finalize(this);
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenDrop(BinaryenModuleRef module,
                                   BinaryenExpressionRef value) {
  auto* ret = Builder(*(Module*)module).makeDrop((Expression*)value);
  return static_cast<Expression*>(ret);
}